

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O0

UINT32 __thiscall TreeModel::base(TreeModel *this,UModelIndex *current)

{
  bool bVar1;
  UINT32 UVar2;
  UINT32 UVar3;
  undefined1 local_38 [8];
  UModelIndex parent;
  UModelIndex *current_local;
  TreeModel *this_local;
  
  parent.m = (TreeModel *)current;
  bVar1 = UModelIndex::isValid(current);
  if (bVar1) {
    UModelIndex::parent((UModelIndex *)local_38,(UModelIndex *)parent.m);
    bVar1 = UModelIndex::isValid((UModelIndex *)local_38);
    if (bVar1) {
      UVar2 = offset(this,(UModelIndex *)parent.m);
      UVar3 = base(this,(UModelIndex *)local_38);
      this_local._4_4_ = UVar2 + UVar3;
    }
    else {
      this_local._4_4_ = offset(this,(UModelIndex *)parent.m);
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

UINT32 TreeModel::base(const UModelIndex &current) const
{
    // Rewrite this as loop if we ever see an image that is too deep for this naive implementation
    if (!current.isValid())
        return 0;
    
    UModelIndex parent = current.parent();
    if (!parent.isValid())
        return offset(current);
    else {
        return offset(current) + base(parent);
    }
}